

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdatabase_p.h
# Opt level: O0

void __thiscall QtFontStyle::QtFontStyle(QtFontStyle *this,Key *k)

{
  Key *in_RSI;
  Key *in_RDI;
  
  Key::Key(in_RDI,in_RSI);
  in_RDI[1] = (Key)((uint)in_RDI[1] & 0xfffffffe);
  in_RDI[1] = (Key)((uint)in_RDI[1] & 0xfffffffd);
  in_RDI[1] = (Key)((uint)in_RDI[1] & 3);
  *(undefined8 *)(in_RDI + 2) = 0;
  QString::QString((QString *)0x74a99e);
  return;
}

Assistant:

QtFontStyle(const Key &k)
        : key(k)
        , bitmapScalable(false)
        , smoothScalable(false)
        , count(0)
        , pixelSizes(nullptr)
    {
    }